

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuUtils.cpp
# Opt level: O2

void showBasketList(Farm *farm)

{
  double dVar1;
  pointer pBVar2;
  ostream *poVar3;
  pointer pBVar4;
  _Hash_node_base *p_Var5;
  vector<Basket,_std::allocator<Basket>_> baskets;
  Basket b;
  undefined1 local_68 [56];
  
  line(0x14,'-');
  poVar3 = std::operator<<((ostream *)&std::cout,"Baskets");
  std::endl<char,std::char_traits<char>>(poVar3);
  line(0x14,'-');
  Farm::getBaskets((unordered_map<int,_std::vector<Basket,_std::allocator<Basket>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>_>_>
                    *)local_68,farm);
  for (p_Var5 = (_Hash_node_base *)local_68._16_8_; p_Var5 != (_Hash_node_base *)0x0;
      p_Var5 = p_Var5->_M_nxt) {
    std::vector<Basket,_std::allocator<Basket>_>::vector
              (&baskets,(vector<Basket,_std::allocator<Basket>_> *)(p_Var5 + 2));
    pBVar2 = baskets.super__Vector_base<Basket,_std::allocator<Basket>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pBVar4 = baskets.super__Vector_base<Basket,_std::allocator<Basket>_>._M_impl.
                  super__Vector_impl_data._M_start; pBVar4 != pBVar2; pBVar4 = pBVar4 + 1) {
      b.weight = pBVar4->weight;
      b.client_nif = pBVar4->client_nif;
      b._12_4_ = *(undefined4 *)&pBVar4->field_0xc;
      poVar3 = std::operator<<((ostream *)&std::cout,"Client\'s NIF: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)&p_Var5[1]._M_nxt);
      std::operator<<(poVar3," | Weight: ");
      dVar1 = Basket::getWeight(&b);
      poVar3 = std::ostream::_M_insert<double>(dVar1);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    std::_Vector_base<Basket,_std::allocator<Basket>_>::~_Vector_base
              (&baskets.super__Vector_base<Basket,_std::allocator<Basket>_>);
  }
  std::
  _Hashtable<int,_std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>,_std::allocator<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>,_std::allocator<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_68);
  line(0x14,'-');
  std::__cxx11::string::string((string *)local_68,"ENTER to go back",(allocator *)&baskets);
  enterWait((string *)local_68);
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

void showBasketList(Farm &farm){
    line(20);
    cout << "Baskets" << endl;
    line(20);
    for (const auto& cb_pair : farm.getBaskets()) {
        vector<Basket> baskets = cb_pair.second;
        for (Basket b: baskets){
            cout << "Client's NIF: " << cb_pair.first << " | Weight: " << b.getWeight() << endl;
        }
    }
    line(20);
    enterWait();
}